

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

void __thiscall Fl_Widget::copy_label(Fl_Widget *this,char *a)

{
  byte *pbVar1;
  char *a_00;
  
  if (((this->flags_ & 0x400) == 0) || ((this->label_).value != a)) {
    if (a == (char *)0x0) {
      label(this,(char *)0x0);
      return;
    }
    a_00 = strdup(a);
    label(this,a_00);
    pbVar1 = (byte *)((long)&this->flags_ + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void
Fl_Widget::copy_label(const char *a) {
  // reassigning a copied label remains the same copied label
  if ((flags() & COPIED_LABEL) && (label_.value == a))
    return;
  if (a) {
    label(strdup(a));
    set_flag(COPIED_LABEL);
  } else {
    label(0);
  }
}